

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__encode_uint8_linear_BGRA(void *outputp,int width_times_channels,float *encode)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uchar *puVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  __m128i b_1;
  __m128i a_1;
  __m128 bf_1;
  __m128 af_1;
  __m128i i0;
  __m128 e0_1;
  __m128i b;
  __m128i a;
  __m128 bf;
  __m128 af;
  __m128i i;
  __m128 e1;
  __m128 e0;
  float *end_encode_m8;
  uchar *end_output;
  uchar *output;
  float *encode_local;
  int width_times_channels_local;
  void *outputp_local;
  short local_158;
  short sStack_156;
  short sStack_154;
  short sStack_152;
  short local_138;
  short sStack_136;
  short sStack_134;
  short sStack_132;
  short sStack_130;
  short sStack_12e;
  short sStack_12c;
  short sStack_12a;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  
  puVar12 = (uchar *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 8) {
    output = (uchar *)encode;
    for (end_output = (uchar *)((long)outputp + 4); end_output <= puVar12;
        end_output = end_output + 4) {
      local_128 = (float)*(undefined8 *)output;
      fStack_124 = (float)((ulong)*(undefined8 *)output >> 0x20);
      fStack_120 = (float)*(undefined8 *)(output + 8);
      fStack_11c = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
      uVar1 = CONCAT44(fStack_124 + 0.5,fStack_120 + 0.5);
      uVar2 = CONCAT44(fStack_11c + 0.5,local_128 + 0.5);
      auVar3._8_8_ = uVar2;
      auVar3._0_8_ = uVar1;
      auVar16._8_8_ = 0x437f0000437f0000;
      auVar16._0_8_ = 0x437f0000437f0000;
      auVar16 = minps(auVar3,auVar16);
      auVar15._8_8_ = uVar2;
      auVar15._0_8_ = uVar1;
      auVar14._8_8_ = 0x437f0000437f0000;
      auVar14._0_8_ = 0x437f0000437f0000;
      auVar14 = minps(auVar15,auVar14);
      auVar15 = maxps(auVar16,ZEXT816(0));
      auVar14 = maxps(auVar14,ZEXT816(0));
      local_78 = auVar15._0_4_;
      fStack_74 = auVar15._4_4_;
      fStack_70 = auVar15._8_4_;
      fStack_6c = auVar15._12_4_;
      b_1[1] = CONCAT44((int)fStack_74,(int)local_78);
      a_1[0]._0_4_ = (int)fStack_70;
      a_1[0]._4_4_ = (int)fStack_6c;
      local_88 = auVar14._0_4_;
      fStack_84 = auVar14._4_4_;
      fStack_80 = auVar14._8_4_;
      fStack_7c = auVar14._12_4_;
      auVar8._4_4_ = (int)fStack_84;
      auVar8._0_4_ = (int)local_88;
      auVar8._12_4_ = (int)fStack_7c;
      auVar8._8_4_ = (int)fStack_80;
      auVar9._8_8_ = a_1[0];
      auVar9._0_8_ = b_1[1];
      auVar14 = packssdw(auVar9,auVar8);
      local_158 = auVar14._0_2_;
      sStack_156 = auVar14._2_2_;
      sStack_154 = auVar14._4_2_;
      sStack_152 = auVar14._6_2_;
      *(uint *)(end_output + -4) =
           CONCAT13((0 < sStack_152) * (sStack_152 < 0x100) * auVar14[6] - (0xff < sStack_152),
                    CONCAT12((0 < sStack_154) * (sStack_154 < 0x100) * auVar14[4] -
                             (0xff < sStack_154),
                             CONCAT11((0 < sStack_156) * (sStack_156 < 0x100) * auVar14[2] -
                                      (0xff < sStack_156),
                                      (0 < local_158) * (local_158 < 0x100) * auVar14[0] -
                                      (0xff < local_158))));
      output = output + 0x10;
    }
  }
  else {
    end_output = (uchar *)outputp;
    output = (uchar *)encode;
    do {
      do {
        local_e8 = (float)*(undefined8 *)output;
        fStack_e4 = (float)((ulong)*(undefined8 *)output >> 0x20);
        fStack_e0 = (float)*(undefined8 *)(output + 8);
        fStack_dc = (float)((ulong)*(undefined8 *)(output + 8) >> 0x20);
        local_108 = (float)*(undefined8 *)(output + 0x10);
        fStack_104 = (float)((ulong)*(undefined8 *)(output + 0x10) >> 0x20);
        fStack_100 = (float)*(undefined8 *)(output + 0x18);
        fStack_fc = (float)((ulong)*(undefined8 *)(output + 0x18) >> 0x20);
        auVar7._4_4_ = fStack_e4 + 0.5;
        auVar7._0_4_ = fStack_e0 + 0.5;
        auVar7._12_4_ = fStack_dc + 0.5;
        auVar7._8_4_ = local_e8 + 0.5;
        auVar5._4_4_ = fStack_104 + 0.5;
        auVar5._0_4_ = fStack_100 + 0.5;
        auVar5._12_4_ = fStack_fc + 0.5;
        auVar5._8_4_ = local_108 + 0.5;
        auVar6._8_8_ = 0x437f0000437f0000;
        auVar6._0_8_ = 0x437f0000437f0000;
        auVar15 = minps(auVar7,auVar6);
        auVar4._8_8_ = 0x437f0000437f0000;
        auVar4._0_8_ = 0x437f0000437f0000;
        auVar14 = minps(auVar5,auVar4);
        auVar15 = maxps(auVar15,ZEXT816(0));
        auVar14 = maxps(auVar14,ZEXT816(0));
        local_58 = auVar15._0_4_;
        fStack_54 = auVar15._4_4_;
        fStack_50 = auVar15._8_4_;
        fStack_4c = auVar15._12_4_;
        b[1] = CONCAT44((int)fStack_54,(int)local_58);
        a[0]._0_4_ = (int)fStack_50;
        a[0]._4_4_ = (int)fStack_4c;
        local_68 = auVar14._0_4_;
        fStack_64 = auVar14._4_4_;
        fStack_60 = auVar14._8_4_;
        fStack_5c = auVar14._12_4_;
        auVar10._4_4_ = (int)fStack_64;
        auVar10._0_4_ = (int)local_68;
        auVar10._12_4_ = (int)fStack_5c;
        auVar10._8_4_ = (int)fStack_60;
        auVar11._8_8_ = a[0];
        auVar11._0_8_ = b[1];
        auVar14 = packssdw(auVar11,auVar10);
        local_138 = auVar14._0_2_;
        sStack_136 = auVar14._2_2_;
        sStack_134 = auVar14._4_2_;
        sStack_132 = auVar14._6_2_;
        sStack_130 = auVar14._8_2_;
        sStack_12e = auVar14._10_2_;
        sStack_12c = auVar14._12_2_;
        sStack_12a = auVar14._14_2_;
        *(ulong *)end_output =
             CONCAT17((0 < sStack_12a) * (sStack_12a < 0x100) * auVar14[0xe] - (0xff < sStack_12a),
                      CONCAT16((0 < sStack_12c) * (sStack_12c < 0x100) * auVar14[0xc] -
                               (0xff < sStack_12c),
                               CONCAT15((0 < sStack_12e) * (sStack_12e < 0x100) * auVar14[10] -
                                        (0xff < sStack_12e),
                                        CONCAT14((0 < sStack_130) * (sStack_130 < 0x100) *
                                                 auVar14[8] - (0xff < sStack_130),
                                                 CONCAT13((0 < sStack_132) * (sStack_132 < 0x100) *
                                                          auVar14[6] - (0xff < sStack_132),
                                                          CONCAT12((0 < sStack_134) *
                                                                   (sStack_134 < 0x100) * auVar14[4]
                                                                   - (0xff < sStack_134),
                                                                   CONCAT11((0 < sStack_136) *
                                                                            (sStack_136 < 0x100) *
                                                                            auVar14[2] -
                                                                            (0xff < sStack_136),
                                                                            (0 < local_138) *
                                                                            (local_138 < 0x100) *
                                                                            auVar14[0] -
                                                                            (0xff < local_138)))))))
                     );
        output = output + 0x20;
        end_output = end_output + 8;
      } while (end_output <= puVar12 + -8);
      bVar13 = end_output != puVar12;
      end_output = puVar12 + -8;
      output = (uchar *)(encode + (long)width_times_channels + -8);
    } while (bVar13);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_linear )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char *) outputp;
  unsigned char * end_output = ( (unsigned char *) output ) + width_times_channels;

  #ifdef STBIR_SIMD
  if ( width_times_channels >= stbir__simdfX_float_count*2 )
  {
    float const * end_encode_m8 = encode + width_times_channels - stbir__simdfX_float_count*2;
    end_output -= stbir__simdfX_float_count*2;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdfX e0, e1;
      stbir__simdi i;
      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdfX_add_mem( e0, STBIR_simd_point5X, encode );
      stbir__simdfX_add_mem( e1, STBIR_simd_point5X, encode+stbir__simdfX_float_count );
      stbir__encode_simdfX_unflip( e0 );
      stbir__encode_simdfX_unflip( e1 );
      #ifdef STBIR_SIMD8
      stbir__simdf8_pack_to_16bytes( i, e0, e1 );
      stbir__simdi_store( output, i );
      #else
      stbir__simdf_pack_to_8bytes( i, e0, e1 );
      stbir__simdi_store2( output, i );
      #endif
      encode += stbir__simdfX_float_count*2;
      output += stbir__simdfX_float_count*2;
      if ( output <= end_output )
        continue;
      if ( output == ( end_output + stbir__simdfX_float_count*2 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m8;
    }
    return;
  }

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  STBIR_NO_UNROLL_LOOP_START
  while( output <= end_output )
  {
    stbir__simdf e0;
    stbir__simdi i0;
    STBIR_NO_UNROLL(encode);
    stbir__simdf_load( e0, encode );
    stbir__simdf_add( e0, STBIR__CONSTF(STBIR_simd_point5), e0 );
    stbir__encode_simdf4_unflip( e0 );
    stbir__simdf_pack_to_8bytes( i0, e0, e0 );  // only use first 4
    *(int*)(output-4) = stbir__simdi_to_int( i0 );
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #else

  // try to do blocks of 4 when you can
  #if stbir__coder_min_num != 3 // doesn't divide cleanly by four
  output += 4;
  while( output <= end_output )
  {
    float f;
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 255); output[0-4] = (unsigned char)f;
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 255); output[1-4] = (unsigned char)f;
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 255); output[2-4] = (unsigned char)f;
    f = encode[stbir__encode_order3] + 0.5f; STBIR_CLAMP(f, 0, 255); output[3-4] = (unsigned char)f;
    output += 4;
    encode += 4;
  }
  output -= 4;
  #endif

  #endif

  // do the remnants
  #if stbir__coder_min_num < 4
  STBIR_NO_UNROLL_LOOP_START
  while( output < end_output )
  {
    float f;
    STBIR_NO_UNROLL(encode);
    f = encode[stbir__encode_order0] + 0.5f; STBIR_CLAMP(f, 0, 255); output[0] = (unsigned char)f;
    #if stbir__coder_min_num >= 2
    f = encode[stbir__encode_order1] + 0.5f; STBIR_CLAMP(f, 0, 255); output[1] = (unsigned char)f;
    #endif
    #if stbir__coder_min_num >= 3
    f = encode[stbir__encode_order2] + 0.5f; STBIR_CLAMP(f, 0, 255); output[2] = (unsigned char)f;
    #endif
    output += stbir__coder_min_num;
    encode += stbir__coder_min_num;
  }
  #endif
}